

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool google::protobuf::anon_unknown_1::RetrieveOptions
               (int depth,Message *options,DescriptorPool *pool,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *option_entries)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Descriptor *type;
  Message *pMVar3;
  undefined4 extraout_var_01;
  MessageLite *this;
  LogMessage *pLVar4;
  undefined4 extraout_var_02;
  LogFinisher local_91;
  scoped_ptr<google::protobuf::Message> dynamic_options;
  LogMessage local_88;
  DynamicMessageFactory factory;
  
  iVar2 = (*(options->super_MessageLite)._vptr_MessageLite[0x17])(options);
  if (*(DescriptorPool **)(*(long *)(CONCAT44(extraout_var,iVar2) + 0x10) + 0x10) != pool) {
    iVar2 = (*(options->super_MessageLite)._vptr_MessageLite[0x17])(options);
    type = DescriptorPool::FindMessageTypeByName
                     (pool,*(string **)(CONCAT44(extraout_var_00,iVar2) + 8));
    if (type != (Descriptor *)0x0) {
      DynamicMessageFactory::DynamicMessageFactory(&factory);
      pMVar3 = DynamicMessageFactory::GetPrototype(&factory,type);
      iVar2 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[3])(pMVar3);
      dynamic_options.ptr_ = (Message *)CONCAT44(extraout_var_01,iVar2);
      this = &internal::scoped_ptr<google::protobuf::Message>::operator->(&dynamic_options)->
              super_MessageLite;
      MessageLite::SerializeAsString_abi_cxx11_((string *)&local_88,&options->super_MessageLite);
      bVar1 = MessageLite::ParseFromString(this,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      if (bVar1) {
        options = internal::scoped_ptr<google::protobuf::Message>::operator*(&dynamic_options);
      }
      else {
        internal::LogMessage::LogMessage
                  (&local_88,LOGLEVEL_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                   ,0x888);
        pLVar4 = internal::LogMessage::operator<<(&local_88,"Found invalid proto option data for: ")
        ;
        iVar2 = (*(options->super_MessageLite)._vptr_MessageLite[0x17])(options);
        pLVar4 = internal::LogMessage::operator<<
                           (pLVar4,*(string **)(CONCAT44(extraout_var_02,iVar2) + 8));
        internal::LogFinisher::operator=(&local_91,pLVar4);
        internal::LogMessage::~LogMessage(&local_88);
      }
      bVar1 = RetrieveOptionsAssumingRightPool(depth,options,option_entries);
      if (dynamic_options.ptr_ != (Message *)0x0) {
        (*((dynamic_options.ptr_)->super_MessageLite)._vptr_MessageLite[1])();
      }
      DynamicMessageFactory::~DynamicMessageFactory(&factory);
      return bVar1;
    }
  }
  bVar1 = RetrieveOptionsAssumingRightPool(depth,options,option_entries);
  return bVar1;
}

Assistant:

bool RetrieveOptions(int depth, const Message& options,
                     const DescriptorPool* pool,
                     std::vector<string>* option_entries) {
  // When printing custom options for a descriptor, we must use an options
  // message built on top of the same DescriptorPool where the descriptor
  // is coming from. This is to ensure we are interpreting custom options
  // against the right pool.
  if (options.GetDescriptor()->file()->pool() == pool) {
    return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
  } else {
    const Descriptor* option_descriptor =
        pool->FindMessageTypeByName(options.GetDescriptor()->full_name());
    if (option_descriptor == NULL) {
      // google/protobuf/descriptor.proto is not in the pool. This means no
      // custom options are used so we are safe to proceed with the compiled
      // options message type.
      return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
    }
    DynamicMessageFactory factory;
    google::protobuf::scoped_ptr<Message> dynamic_options(
        factory.GetPrototype(option_descriptor)->New());
    if (dynamic_options->ParseFromString(options.SerializeAsString())) {
      return RetrieveOptionsAssumingRightPool(depth, *dynamic_options,
                                              option_entries);
    } else {
      GOOGLE_LOG(ERROR) << "Found invalid proto option data for: "
                 << options.GetDescriptor()->full_name();
      return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
    }
  }
}